

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O2

void cjson_compare_should_compare_numbers(void)

{
  cJSON_bool cVar1;
  
  cVar1 = compare_from_string("1","1",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x3f);
  }
  cVar1 = compare_from_string("1","1",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x40);
  }
  cVar1 = compare_from_string("0.0001","0.0001",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x41);
  }
  cVar1 = compare_from_string("0.0001","0.0001",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x42);
  }
  cVar1 = compare_from_string("1","2",1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x44);
  }
  cVar1 = compare_from_string("1","2",0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x45);
    return;
  }
  return;
}

Assistant:

static void cjson_compare_should_compare_numbers(void)
{
    TEST_ASSERT_TRUE(compare_from_string("1", "1", true));
    TEST_ASSERT_TRUE(compare_from_string("1", "1", false));
    TEST_ASSERT_TRUE(compare_from_string("0.0001", "0.0001", true));
    TEST_ASSERT_TRUE(compare_from_string("0.0001", "0.0001", false));

    TEST_ASSERT_FALSE(compare_from_string("1", "2", true));
    TEST_ASSERT_FALSE(compare_from_string("1", "2", false));
}